

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

bool __thiscall QTreeWidgetItem::isExpanded(QTreeWidgetItem *this)

{
  QTreeModel *m;
  QTreeWidgetPrivate *__s;
  QTreeWidgetItem *in_RDI;
  long in_FS_OFFSET;
  QTreeModel *model;
  SkipSorting skipSorting;
  QModelIndex *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  QTreeWidget *in_stack_ffffffffffffffa8;
  int __c;
  bool local_31;
  undefined1 local_30 [24];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  m = treeModel(in_RDI,in_stack_ffffffffffffffa8);
  __c = (int)in_RDI;
  if (m == (QTreeModel *)0x0) {
    local_31 = false;
  }
  else {
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTreeModel::SkipSorting::SkipSorting((SkipSorting *)local_18,m);
    __s = QTreeWidget::d_func((QTreeWidget *)0x912910);
    QTreeWidgetPrivate::index((QTreeWidgetPrivate *)local_30,(char *)__s,__c);
    local_31 = QTreeView::isExpanded
                         ((QTreeView *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
                          ,in_stack_ffffffffffffff98);
    QTreeModel::SkipSorting::~SkipSorting((SkipSorting *)local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeWidgetItem::isExpanded() const
{
    const QTreeModel *model = treeModel();
    if (!model)
        return false;
    QTreeModel::SkipSorting skipSorting(model);
    return view->isExpanded(view->d_func()->index(this));
}